

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

mchunkptr mmap_resize(mstate m,mchunkptr oldp,size_t nb,int flags)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  size_t __old_len;
  char *pcVar4;
  long lVar5;
  size_t psize;
  mchunkptr newp;
  char *cp;
  size_t newmmsize;
  size_t oldmmsize;
  size_t offset;
  size_t oldsize;
  int flags_local;
  size_t nb_local;
  mchunkptr oldp_local;
  mstate m_local;
  
  uVar3 = oldp->head & 0xfffffffffffffff8;
  if (nb >> 3 < 0x20) {
    m_local = (mstate)0x0;
  }
  else if ((uVar3 < nb + 8) || (m_local = (mstate)oldp, mparams.granularity * 2 < uVar3 - nb)) {
    sVar2 = oldp->prev_foot;
    __old_len = uVar3 + sVar2 + 0x20;
    uVar3 = nb + mparams.page_size + 0x3e & (mparams.page_size - 1 ^ 0xffffffffffffffff);
    pcVar4 = (char *)mremap((void *)((long)oldp - sVar2),__old_len,uVar3,flags);
    if (pcVar4 == (char *)0xffffffffffffffff) {
      m_local = (mstate)0x0;
    }
    else {
      m_local = (mstate)(pcVar4 + sVar2);
      lVar5 = uVar3 - sVar2;
      m_local->dvsize = lVar5 - 0x20;
      pcVar1 = (char *)((long)m_local + lVar5 + -0x18);
      pcVar1[0] = '\v';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1 = (char *)((long)m_local + lVar5 + -0x10);
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      if (pcVar4 < m->least_addr) {
        m->least_addr = pcVar4;
      }
      uVar3 = (uVar3 - __old_len) + m->footprint;
      m->footprint = uVar3;
      if (m->max_footprint < uVar3) {
        m->max_footprint = m->footprint;
      }
    }
  }
  return (mchunkptr)m_local;
}

Assistant:

static mchunkptr mmap_resize(mstate m, mchunkptr oldp, size_t nb, int flags) {
  size_t oldsize = chunksize(oldp);
  (void)flags; /* placate people compiling -Wunused */
  if (is_small(nb)) /* Can't shrink mmap regions below small size */
    return 0;
  /* Keep old chunk if big enough but not too big */
  if (oldsize >= nb + SIZE_T_SIZE &&
      (oldsize - nb) <= (mparams.granularity << 1))
    return oldp;
  else {
    size_t offset = oldp->prev_foot;
    size_t oldmmsize = oldsize + offset + MMAP_FOOT_PAD;
    size_t newmmsize = mmap_align(nb + SIX_SIZE_T_SIZES + CHUNK_ALIGN_MASK);
    char* cp = (char*)CALL_MREMAP((char*)oldp - offset,
                                  oldmmsize, newmmsize, flags);
    if (cp != CMFAIL) {
      mchunkptr newp = (mchunkptr)(cp + offset);
      size_t psize = newmmsize - offset - MMAP_FOOT_PAD;
      newp->head = psize;
      mark_inuse_foot(m, newp, psize);
      chunk_plus_offset(newp, psize)->head = FENCEPOST_HEAD;
      chunk_plus_offset(newp, psize+SIZE_T_SIZE)->head = 0;

      if (cp < m->least_addr)
        m->least_addr = cp;
      if ((m->footprint += newmmsize - oldmmsize) > m->max_footprint)
        m->max_footprint = m->footprint;
      check_mmapped_chunk(m, newp);
      return newp;
    }
  }
  return 0;
}